

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
resizeLike<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,1,3,false>>
          (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this,
          EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_> *_other)

{
  Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *this_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index othersize;
  Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *other;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_> *_other_local;
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_local;
  
  this_00 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>::derived
                      (_other);
  MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::rows
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0> *)
             this_00);
  MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::cols
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0> *)
             this_00);
  IVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0>
                      *)this_00);
  IVar2 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::cols
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0>
                      *)this_00);
  IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0>
                      *)this_00);
  bVar4 = true;
  if (IVar3 != 1) {
    IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0>
                        *)this_00);
    bVar4 = IVar3 == 1;
  }
  if (!bVar4) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x16e,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 3, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, 3>, 1, 3>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,IVar1 * IVar2,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }